

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void * GA_Getmem(int type,int nelem,int grp_id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Integer IVar4;
  long *plVar5;
  void *__src;
  int in_ESI;
  int in_EDI;
  Integer status;
  char *myptr;
  int extra;
  int bytes;
  long id;
  int i;
  int rc;
  char **ptr_arr;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = (int)(GAnproc << 3) + 0x20;
  IVar4 = pnga_type_f2c((long)in_EDI);
  iVar2 = in_ESI * (int)ga_types[(int)IVar4 + -1000].size;
  if (GA_memory_limited == 0) {
    plVar5 = (long *)0x1;
  }
  else {
    GA_total_memory = GA_total_memory - (iVar2 + iVar1);
    plVar5 = (long *)(long)(int)(uint)(-1 < GA_total_memory);
    pnga_type_f2c(0x3f2);
    pnga_gop(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
             ,CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffc8);
    if (plVar5 == (long *)0x0) {
      GA_total_memory = (iVar2 + iVar1) + GA_total_memory;
    }
  }
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  __src = malloc(GAnproc << 3);
  iVar3 = gai_getmem((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,CONCAT44(iVar2,iVar1),iVar3,plVar5,
                     in_stack_ffffffffffffffbc);
  if (iVar3 != 0) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  plVar5 = *(long **)((long)__src + GAme * 8);
  for (iVar3 = 0; iVar3 < GAnproc; iVar3 = iVar3 + 1) {
    *(long *)((long)__src + (long)iVar3 * 8) =
         *(long *)((long)__src + (long)iVar3 * 8) + (long)iVar1;
  }
  *plVar5 = (long)iVar1 + (long)in_stack_ffffffffffffffd8;
  plVar5[1] = (long)(int)IVar4;
  plVar5[2] = (long)(iVar2 + iVar1);
  memcpy(plVar5 + 4,__src,GAnproc << 3);
  free(__src);
  return (void *)((long)plVar5 + (long)iVar1);
}

Assistant:

void *GA_Getmem(int type, int nelem, int grp_id)
{
char **ptr_arr=(char**)0;
int  rc,i;
long id;
int bytes;
int extra=sizeof(getmem_t)+GAnproc*sizeof(char*);
char *myptr;
Integer status;
     type = pnga_type_f2c(type);	
     bytes = nelem *  GAsizeofM(type);
     if(GA_memory_limited){
         GA_total_memory -= bytes+extra;
         status = (GA_total_memory >= 0) ? 1 : 0;
         /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
         pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
         if(!status)GA_total_memory +=bytes+extra;
     }else status = 1;

     ptr_arr=malloc(GAnproc*sizeof(char**));
     rc= gai_getmem("ga_getmem", ptr_arr,(Integer)bytes+extra, type, &id, grp_id);
     if(rc)pnga_error("ga_getmem: failed to allocate memory",bytes+extra);

     myptr = ptr_arr[GAme];  

     /* make sure that remote memory addresses point to user memory */
     for(i=0; i<GAnproc; i++)ptr_arr[i] += extra;

#ifndef AVOID_MA_STORAGE
     if(ARMCI_Uses_shm()) 
#endif
        id += extra; /* id is used to store offset */

     /* stuff the type and id info at the beginning */
     ((getmem_t*)myptr)->id = id;
     ((getmem_t*)myptr)->type = type;
     ((getmem_t*)myptr)->size = bytes+extra;

     /* add ptr info */
     memcpy(myptr+sizeof(getmem_t),ptr_arr,(size_t)GAnproc*sizeof(char**));
     free(ptr_arr);

     return (void*)(myptr+extra);
}